

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  const_iterator ppcVar10;
  precise_unit pVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  undefined8 local_178;
  allocator local_169;
  string local_168;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  value_type *seq;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<const_char_*,_7UL> *__range1_1;
  string local_e8;
  undefined1 local_c8 [8];
  precise_unit retunit;
  size_t len;
  size_type fnd;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  const_iterator local_50;
  value_type *irep;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_const_char_*>,_62UL> *__range1;
  uint64_t uStack_28;
  bool changed;
  uint64_t match_flags_local;
  string *unit_local;
  double local_10;
  
  uStack_28 = match_flags;
  match_flags_local = (uint64_t)unit;
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 3) {
    local_10._0_4_ = (unit_data)0xfa94a488;
    local_10._4_4_ = 0;
    unit_local = (string *)0x7ff4000000000000;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::front();
    if ((*pcVar5 == 'u') &&
       ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit), *pcVar5 == 'S' ||
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit), *pcVar5 == 'K')))) {
      puVar6 = (undefined1 *)std::__cxx11::string::front();
      *puVar6 = 0x55;
    }
    __range1._7_1_ = 0;
    __begin1 = localityModifiers::internationlReplacements._M_elems;
    __end1 = std::array<std::pair<const_char_*,_const_char_*>,_62UL>::begin
                       (&localityModifiers::internationlReplacements);
    irep = std::array<std::pair<const_char_*,_const_char_*>,_62UL>::end
                     (&localityModifiers::internationlReplacements);
    for (; __end1 != irep; __end1 = __end1 + 1) {
      local_50 = __end1;
      sVar7 = strlen(__end1->first);
      if (sVar7 == 2) {
        iVar3 = strncmp(local_50->first,local_50->second,2);
        if (iVar3 != 0) {
LAB_001accca:
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit);
          if ('\0' < *pcVar5) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit);
            iVar3 = isupper((int)*pcVar5);
            if (iVar3 != 0) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit);
              iVar3 = toupper((int)*pcVar5);
              if ((iVar3 == *local_50->first) &&
                 (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit),
                 *pcVar5 == local_50->first[1])) {
                pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit);
                iVar3 = toupper((int)*pcVar5);
                puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit);
                *puVar6 = (char)iVar3;
              }
            }
          }
          goto LAB_001acd86;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,1,'_',&local_91);
        std::operator+(&local_70,&local_90,local_50->second);
        bVar1 = ends_with(unit,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        if (!bVar1) goto LAB_001accca;
      }
      else {
LAB_001acd86:
        uVar4 = std::__cxx11::string::find((char *)unit,(ulong)local_50->first);
        if (uVar4 != 0xffffffffffffffff) {
          sVar7 = strlen(local_50->first);
          retunit._8_8_ = sVar7;
          sVar8 = std::__cxx11::string::size();
          if (sVar7 == sVar8) {
            local_10._0_4_ = (unit_data)0xfa94a488;
            local_10._4_4_ = 0;
            unit_local = (string *)0x7ff4000000000000;
            return _unit_local;
          }
          std::__cxx11::string::erase((ulong)unit,uVar4);
          if ((uVar4 != 0) &&
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit), *pcVar5 == '_')) {
            std::__cxx11::string::erase((ulong)unit,uVar4 - 1);
          }
          uVar9 = std::__cxx11::string::size();
          if ((uVar4 < uVar9) &&
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit), *pcVar5 == '_')) {
            std::__cxx11::string::erase((ulong)unit,uVar4);
          }
          std::__cxx11::string::push_back((char)unit);
          std::__cxx11::string::append((char *)unit);
          __range1._7_1_ = 1;
          break;
        }
      }
    }
    bVar2 = clearEmptySegments(unit);
    bVar1 = (__range1._7_1_ & 1) != 0;
    __range1._7_1_ = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      std::__cxx11::string::string((string *)&local_e8,(string *)unit);
      pVar11 = unit_from_string_internal(&local_e8,uStack_28 | 0xc00000);
      retunit.multiplier_ = pVar11._8_8_;
      local_c8 = (undefined1  [8])pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&local_e8);
      bVar1 = is_error((precise_unit *)local_c8);
      if ((bVar1) && ((uStack_28 & 0x400000) == 0)) {
        std::__cxx11::string::string((string *)&__range1_1,(string *)unit);
        _unit_local = localityModifiers((string *)&__range1_1,uStack_28 | 0x400000);
        std::__cxx11::string::~string((string *)&__range1_1);
      }
      else {
        local_10 = retunit.multiplier_;
        unit_local = (string *)local_c8;
      }
    }
    else {
      uVar4 = std::__cxx11::string::size();
      if (uVar4 < 4) {
        local_10._0_4_ = (unit_data)0xfa94a488;
        local_10._4_4_ = 0;
        unit_local = (string *)0x7ff4000000000000;
      }
      else {
        __end1_1 = std::array<const_char_*,_7UL>::begin(&localityModifiers::rotSequences);
        ppcVar10 = std::array<const_char_*,_7UL>::end(&localityModifiers::rotSequences);
        for (; __end1_1 != ppcVar10; __end1_1 = __end1_1 + 1) {
          nunit.field_2._8_8_ = __end1_1;
          iVar3 = std::__cxx11::string::compare((ulong)unit,0,(char *)0x2);
          if (iVar3 == 0) {
            std::__cxx11::string::operator[]((ulong)unit);
            std::__cxx11::string::substr((ulong)local_148,(ulong)unit);
            pcVar5 = (char *)std::__cxx11::string::back();
            if (*pcVar5 == 's') {
              std::__cxx11::string::pop_back();
            }
            std::__cxx11::string::push_back((char)local_148);
            std::__cxx11::string::append(local_148);
            _unit_local = get_unit((string *)local_148,uStack_28);
            std::__cxx11::string::~string((string *)local_148);
            return _unit_local;
          }
          pcVar5 = *(char **)nunit.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_168,pcVar5,&local_169);
          bVar1 = ends_with(unit,&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
          if (bVar1) {
            local_188._M_current = (char *)std::__cxx11::string::end();
            local_180 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator-(&local_188,2);
            __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                      ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_178,&local_180)
            ;
            std::__cxx11::string::insert(unit,local_178,0x5f);
            pVar11 = get_unit(unit,uStack_28);
            return pVar11;
          }
        }
        local_10._0_4_ = (unit_data)0xfa94a488;
        local_10._4_4_ = 0;
        unit_local = (string *)0x7ff4000000000000;
      }
    }
  }
  return _unit_local;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}